

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::SortImports::toplevelImport
          (SortImports *this,Local *local,ImportElems *imports,Fodder *groupOpenFodder)

{
  long lVar1;
  pointer pFVar2;
  pointer pFVar3;
  Fodder *groupOpenFodder_00;
  bool bVar4;
  Bind *bind;
  pointer pBVar5;
  AST *pAVar6;
  Local *pLVar7;
  AST *pAVar8;
  ulong uVar9;
  ulong uVar10;
  Fodder beforeNextFodder;
  ImportElems nextImports;
  Fodder nextOpenFodder;
  Fodder adjacentCommentFodder;
  Fodder afterGroup;
  ImportElems newImports;
  Fodder local_108;
  ImportElems local_e8;
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_c8;
  undefined1 local_98 [24];
  Fodder *local_80;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_78;
  ImportElems local_60;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_48;
  
  pBVar5 = (local->binds).
           super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pBVar5 == (local->binds).
                  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_98._0_8_ = (pointer)0x0;
      local_98._8_8_ = (pointer)0x0;
      local_98._16_8_ = (pointer)0x0;
      local_108.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (FodderElement *)0x0;
      local_108.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (FodderElement *)0x0;
      pAVar6 = left_recursive_deep(local->body);
      splitFodder(&local_c8,this,&pAVar6->openFodder);
      local_e8.
      super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98;
      local_e8.
      super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_108;
      std::
      tuple<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
      ::operator=((tuple<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                   *)&local_e8,&local_c8);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_c8.second);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_c8.first);
      if ((local_98._0_8_ == local_98._8_8_) ||
         (((pointer)(local_98._8_8_ + -0x28))->kind == INTERSTITIAL)) {
        local_e8.
        super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.
        super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.
        super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        FodderElement::FodderElement
                  ((FodderElement *)&local_c8,LINE_END,0,0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_e8);
        fodder_push_back((Fodder *)local_98,(FodderElement *)&local_c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c8.first.
                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_e8);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector(&local_48,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)local_98);
      extractImportElems(&local_60,this,&local->binds,&local_48);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_48);
      std::
      vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<jsonnet::internal::SortImports::ImportElem*,std::vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>>>
                ((vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>
                  *)imports,
                 (imports->
                 super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 local_60.
                 super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      bVar4 = groupEndsAfter(this,local);
      if (bVar4) {
        sortGroup(this,imports);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::vector(&local_78,
                 &(imports->
                  super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                  )._M_impl.super__Vector_impl_data._M_finish[-1].adjacentFodder);
        if ((local_108.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_108.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (local_108.
            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].kind == INTERSTITIAL)) {
          local_e8.
          super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.
          super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.
          super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          FodderElement::FodderElement
                    ((FodderElement *)&local_c8,LINE_END,0,0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_e8);
          fodder_push_back(&local_108,(FodderElement *)&local_c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_c8.first.
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_e8);
        }
        pFVar3 = local_108.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pFVar2 = local_108.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_80 = groupOpenFodder;
        if (local_78.
            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_78.
            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::vector(&local_c8.first,&local_108);
        }
        else {
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::vector(&local_c8.first,&local_78);
          if ((pFVar3 != pFVar2) &&
             (fodder_push_back(&local_c8.first,
                               local_108.
                               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               ._M_impl.super__Vector_impl_data._M_start),
             1 < (ulong)(((long)local_108.
                                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_108.
                                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x3333333333333333))) {
            uVar9 = 1;
            uVar10 = 2;
            do {
              std::
              vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ::push_back(&local_c8.first,
                          local_108.
                          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar9);
              uVar9 = ((long)local_108.
                             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_108.
                             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
              bVar4 = uVar10 <= uVar9;
              lVar1 = uVar9 - uVar10;
              uVar9 = uVar10;
              uVar10 = (ulong)((int)uVar10 + 1);
            } while (bVar4 && lVar1 != 0);
          }
        }
        pLVar7 = goodLocalOrNull(this,local->body);
        groupOpenFodder_00 = local_80;
        if (pLVar7 == (Local *)0x0) {
          pAVar6 = local->body;
          pAVar8 = left_recursive_deep(pAVar6);
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&pAVar8->openFodder,&local_c8.first);
        }
        else {
          local_e8.
          super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.
          super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.
          super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pAVar6 = toplevelImport(this,pLVar7,&local_e8,&local_c8.first);
          std::
          vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
          ::~vector(&local_e8);
        }
        pAVar6 = buildGroupAST(this,imports,pAVar6,groupOpenFodder_00);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_c8.first);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_78);
      }
      else {
        if (local_108.
            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_108.
            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("beforeNextFodder.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                        ,0x8e6,
                        "AST *jsonnet::internal::SortImports::toplevelImport(Local *, ImportElems &, const Fodder &)"
                       );
        }
        if (local->body == (AST *)0x0) {
          pLVar7 = (Local *)0x0;
        }
        else {
          pLVar7 = (Local *)__dynamic_cast(local->body,&AST::typeinfo,&Local::typeinfo,0);
        }
        pAVar6 = toplevelImport(this,pLVar7,imports,groupOpenFodder);
      }
      std::
      vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
      ::~vector(&local_60);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_108);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_98);
      return pAVar6;
    }
    if ((pBVar5->body->type != AST_IMPORT) || (pBVar5->functionSugar == true)) break;
    pBVar5 = pBVar5 + 1;
  }
  __assert_fail("isGoodLocal(local)",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                ,0x8c6,
                "AST *jsonnet::internal::SortImports::toplevelImport(Local *, ImportElems &, const Fodder &)"
               );
}

Assistant:

AST *toplevelImport(Local *local, ImportElems &imports, const Fodder &groupOpenFodder)
    {
        assert(isGoodLocal(local));

        Fodder adjacentCommentFodder, beforeNextFodder;
        std::tie(adjacentCommentFodder, beforeNextFodder) = splitFodder(open_fodder(local->body));

        ensureCleanNewline(adjacentCommentFodder);

        ImportElems newImports = extractImportElems(local->binds, adjacentCommentFodder);
        imports.insert(imports.end(), newImports.begin(), newImports.end());

        if (groupEndsAfter(local)) {
            sortGroup(imports);

            Fodder afterGroup = imports.back().adjacentFodder;
            ensureCleanNewline(beforeNextFodder);
            auto nextOpenFodder = concat_fodder(afterGroup, beforeNextFodder);

            // Process the code after the current group:
            AST *bodyAfterGroup;
            Local *next = goodLocalOrNull(local->body);
            if (next) {
                // Another group of imports
                ImportElems nextImports;
                bodyAfterGroup = toplevelImport(next, nextImports, nextOpenFodder);
            } else {
                // Something else
                bodyAfterGroup = local->body;
                open_fodder(bodyAfterGroup) = nextOpenFodder;
            }

            return buildGroupAST(imports, bodyAfterGroup, groupOpenFodder);
        } else {
            assert(beforeNextFodder.empty());
            return toplevelImport(dynamic_cast<Local *>(local->body), imports, groupOpenFodder);
        }
    }